

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O1

int arkInterpResize_Hermite
              (void *arkode_mem,ARKInterp interp,ARKVecResizeFn resize,void *resize_data,
              sunindextype lrw_diff,sunindextype liw_diff,N_Vector y0)

{
  undefined8 uVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  
  if (arkode_mem == (void *)0x0) {
    iVar4 = -0x15;
  }
  else {
    iVar4 = 0;
    if (interp != (ARKInterp)0x0) {
      iVar3 = arkResizeVec((ARKodeMem)arkode_mem,resize,resize_data,lrw_diff,liw_diff,y0,
                           (N_Vector *)((long)interp->content + 8));
      iVar4 = -0x14;
      if (iVar3 != 0) {
        iVar3 = arkResizeVec((ARKodeMem)arkode_mem,resize,resize_data,lrw_diff,liw_diff,y0,
                             (N_Vector *)((long)interp->content + 0x18));
        if (iVar3 != 0) {
          iVar3 = arkResizeVec((ARKodeMem)arkode_mem,resize,resize_data,lrw_diff,liw_diff,y0,
                               (N_Vector *)((long)interp->content + 0x28));
          if (iVar3 != 0) {
            iVar3 = arkResizeVec((ARKodeMem)arkode_mem,resize,resize_data,lrw_diff,liw_diff,y0,
                                 (N_Vector *)((long)interp->content + 0x30));
            if (iVar3 != 0) {
              pvVar2 = interp->content;
              *(undefined8 *)((long)pvVar2 + 0x20) = *(undefined8 *)((long)arkode_mem + 0x110);
              *(undefined8 *)((long)pvVar2 + 0x10) = *(undefined8 *)((long)arkode_mem + 0x118);
              uVar1 = *(undefined8 *)((long)arkode_mem + 0x198);
              *(undefined8 *)((long)pvVar2 + 0x38) = uVar1;
              *(undefined8 *)((long)pvVar2 + 0x40) = uVar1;
              *(undefined8 *)((long)pvVar2 + 0x48) = 0;
              iVar4 = 0;
            }
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int arkInterpResize_Hermite(void* arkode_mem, ARKInterp interp,
                            ARKVecResizeFn resize, void *resize_data,
                            sunindextype lrw_diff, sunindextype liw_diff,
                            N_Vector y0)
{
  ARKodeMem ark_mem;

  /* access ARKodeMem structure */
  if (arkode_mem == NULL)  return(ARK_MEM_NULL);
  ark_mem = (ARKodeMem) arkode_mem;

  /* resize vectors */
  if (interp == NULL)  return(ARK_SUCCESS);

  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                    liw_diff, y0, &HINT_FOLD(interp)))
    return(ARK_MEM_FAIL);

  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                    liw_diff, y0, &HINT_YOLD(interp)))
    return(ARK_MEM_FAIL);

  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                    liw_diff, y0, &HINT_FA(interp)))
    return(ARK_MEM_FAIL);

  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                    liw_diff, y0, &HINT_FB(interp)))
    return(ARK_MEM_FAIL);

  /* update ynew and fnew pointers */
  HINT_YNEW(interp) = ark_mem->yn;
  HINT_FNEW(interp) = ark_mem->fn;

  /* reinitialize time values */
  HINT_TOLD(interp) = ark_mem->tcur;
  HINT_TNEW(interp) = ark_mem->tcur;
  HINT_H(interp)    = RCONST(0.0);

  return(ARK_SUCCESS);
}